

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosmic_protector.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Player *pPVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  ResourceManager *this;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  undefined4 in_register_0000003c;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  list<Entity_*,_std::allocator<Entity_*>_> *plVar9;
  double dVar10;
  Wave local_4c;
  void *local_48;
  Player *local_40;
  void *local_38;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc);
  lVar8 = 1;
  do {
    if (argc <= lVar8) goto LAB_0010dcdd;
    ctx = (EVP_PKEY_CTX *)argv[lVar8];
    iVar3 = strcmp((char *)ctx,"-fullscreen");
    lVar8 = lVar8 + 1;
  } while (iVar3 != 0);
  useFullScreenMode = true;
LAB_0010dcdd:
  iVar3 = init(ctx);
  if ((char)iVar3 == '\0') {
    debug_message("Error in initialization.\n");
    iVar3 = 1;
  }
  else {
    this = ResourceManager::getInstance();
    local_40 = (Player *)ResourceManager::getData(this,1);
    pvVar5 = ResourceManager::getData(this,0x21);
    local_48 = ResourceManager::getData(this,0x22);
    while( true ) {
      if (pvVar5 != (void *)0x0) {
        al_set_audio_stream_playing(pvVar5);
      }
      joypad_find();
      while( true ) {
        iVar3 = do_menu();
        al_rest(0x3fd0000000000000);
        if (iVar3 != 1) break;
        do_highscores(-0x80000000);
      }
      if ((iVar3 == 2) || (iVar3 == -1)) break;
      if (pvVar5 != (void *)0x0) {
        al_drain_audio_stream(pvVar5);
        al_rewind_audio_stream(pvVar5);
      }
      joypad_stop_finding();
      pvVar6 = ResourceManager::getData(this,0);
      uVar4 = al_get_display_orientation(pvVar6);
      local_38 = pvVar6;
      al_set_display_option(pvVar6,0x20,uVar4);
      if (local_48 != (void *)0x0) {
        al_set_audio_stream_playing(local_48,1);
      }
      (*(local_40->super_Entity)._vptr_Entity[8])();
      lastUFO = -1;
      canUFO = true;
      Wave::Wave(&local_4c);
      dVar10 = (double)al_get_time();
      lVar8 = (long)(dVar10 * 1000.0);
      iVar3 = 0;
      while (((entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
               _M_node._M_size != 0 || (bVar2 = Wave::next(&local_4c), bVar2)) &&
             (bVar2 = logic(iVar3), bVar2))) {
        render(iVar3);
        al_rest(0x3f91111111111111);
        dVar10 = (double)al_get_time();
        lVar7 = (long)(dVar10 * 1000.0);
        iVar3 = (int)lVar7 - (int)lVar8;
        lVar8 = lVar7;
        if (0x31 < iVar3) {
          iVar3 = 0x32;
        }
      }
      pvVar6 = local_48;
      plVar9 = &entities_abi_cxx11_;
      while (plVar9 = (list<Entity_*,_std::allocator<Entity_*>_> *)
                      (((_List_base<Entity_*,_std::allocator<Entity_*>_> *)
                       &((_List_node_base *)plVar9)->_M_next)->_M_impl)._M_node.
                      super__List_node_base._M_next, plVar9 != &entities_abi_cxx11_) {
        if (*(long **)((long)plVar9 + 0x10) != (long *)0x0) {
          (**(code **)(**(long **)((long)plVar9 + 0x10) + 0x30))();
        }
      }
      std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::clear(&entities_abi_cxx11_);
      pPVar1 = local_40;
      iVar3 = Player::getScore(local_40);
      do_highscores(iVar3);
      (*(pPVar1->super_Entity)._vptr_Entity[7])(pPVar1);
      if (pvVar6 != (void *)0x0) {
        al_drain_audio_stream(pvVar6);
        al_rewind_audio_stream(pvVar6);
      }
      al_set_display_option(local_38,0x20,10);
    }
    done();
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   if (check_arg(argc, argv, "-fullscreen"))
      useFullScreenMode = true;
   if (!init()) {
      debug_message("Error in initialization.\n");
      return 1;
   }

   ResourceManager& rm = ResourceManager::getInstance();
   Player *player = (Player *)rm.getData(RES_PLAYER);

   ALLEGRO_AUDIO_STREAM *title_music = (ALLEGRO_AUDIO_STREAM *)rm.getData(RES_TITLE_MUSIC);
   ALLEGRO_AUDIO_STREAM *game_music = (ALLEGRO_AUDIO_STREAM *)rm.getData(RES_GAME_MUSIC);

   for (;;) {
      if (title_music) {
         al_set_audio_stream_playing(title_music, true);
      }

      joypad_find();

      while (true) {
         int result = do_menu();
         al_rest(0.250);
         if (result == 1) {
            do_highscores(INT_MIN);
	    continue;
         }
         else if (result == 2 || result == -1) {
            done();
	    return 0;
         }
         break;
      }

      if (title_music) {
         al_drain_audio_stream(title_music);
         al_rewind_audio_stream(title_music);
      }

      joypad_stop_finding();

      ALLEGRO_DISPLAY *display = (ALLEGRO_DISPLAY *)rm.getData(RES_DISPLAY);
      int o = al_get_display_orientation(display);
      al_set_display_option(display, ALLEGRO_SUPPORTED_ORIENTATIONS, o);

      if (game_music) {
         al_set_audio_stream_playing(game_music, true);
      }

      player->load();
      game_loop();
      do_highscores(player->getScore());
      player->destroy();

      if (game_music) {
         al_drain_audio_stream(game_music);
         al_rewind_audio_stream(game_music);
      }

      al_set_display_option(display, ALLEGRO_SUPPORTED_ORIENTATIONS, ALLEGRO_DISPLAY_ORIENTATION_LANDSCAPE);

   }

   return 0;
}